

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone_partitioning.cc
# Opt level: O2

void __thiscall
PolygonTriangulation::build_monotone_chains
          (PolygonTriangulation *this,Monochain_t *monochain,uint32_t trapezoid_index,
          uint32_t from_index,bool go_down)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  Trapezoid_t *trapezoid;
  uint32_t uVar1;
  uint32_t uVar2;
  pointer pTVar3;
  ulong __n;
  PolygonTriangulation *this_01;
  undefined7 in_register_00000081;
  reference rVar4;
  
  this_00 = &this->visited_trapezoids_;
  while( true ) {
    if (trapezoid_index == 0xffffffff) {
      return;
    }
    __n = (ulong)trapezoid_index;
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
    if ((*rVar4._M_p & rVar4._M_mask) != 0) break;
    this_01 = (PolygonTriangulation *)this_00;
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
    *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
    pTVar3 = (this->trapezoids_).
             super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    trapezoid = pTVar3 + __n;
    uVar1 = pTVar3[__n].above1;
    uVar2 = pTVar3[__n].below1;
    add_vertex_to_monochain(this_01,trapezoid,go_down,monochain);
    select_monotone_path(this,trapezoid_index,go_down,uVar2 == from_index || uVar1 == from_index);
    build_monotone_chains
              (this,monochain,(&trapezoid->above1)[(ulong)go_down * 2],trapezoid_index,go_down);
    from_index = trapezoid_index;
    trapezoid_index =
         (&trapezoid->above2)[(CONCAT71(in_register_00000081,go_down) & 0xffffffff) * 2];
  }
  return;
}

Assistant:

void PolygonTriangulation::build_monotone_chains(
    Monochain_t *monochain,
    const uint32_t trapezoid_index,
    const uint32_t from_index,
    const bool go_down
) {
  if ((kInvalidIndex == trapezoid_index)
   || (visited_trapezoids_[trapezoid_index])) {
    return;
  }
  visited_trapezoids_[trapezoid_index] = true;

  const auto &trapezoid = trapezoids_[trapezoid_index];

  // Determine if the current search come from the first children of the trapezoids.
  const bool come_from_left = (from_index == trapezoid.above1)
                                                        || (from_index == trapezoid.below1);

  add_vertex_to_monochain(trapezoid, go_down, monochain);
  select_monotone_path(trapezoid_index, go_down, come_from_left);

  // Continue in the same direction.
  if (go_down) {
    build_monotone_chains(monochain, trapezoid.below1, trapezoid_index, true);
    build_monotone_chains(monochain, trapezoid.below2, trapezoid_index, true);
  } else {
    build_monotone_chains(monochain, trapezoid.above1, trapezoid_index, false);
    build_monotone_chains(monochain, trapezoid.above2, trapezoid_index, false);
  }
}